

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O2

char * print_value(cJSON *item,int depth,int fmt)

{
  double __x;
  bool bVar1;
  char *pcVar2;
  void *__s;
  void *pvVar3;
  ulong uVar4;
  char *pcVar5;
  size_t sVar6;
  size_t sVar7;
  cJSON *pcVar8;
  ulong uVar9;
  char *__s_00;
  size_t sVar10;
  cJSON *pcVar11;
  long lVar12;
  int iVar13;
  ulong uVar14;
  bool bVar15;
  double dVar16;
  double dVar17;
  int local_80;
  int local_64;
  
  if (item == (cJSON *)0x0) {
    return (char *)0x0;
  }
  switch(item->type & 0xff) {
  case 0:
    pcVar2 = "false";
    goto LAB_0018ba51;
  case 1:
    pcVar2 = "true";
    goto LAB_0018ba51;
  case 2:
    pcVar2 = "null";
LAB_0018ba51:
    pcVar2 = cJSON_strdup(pcVar2);
    return pcVar2;
  case 3:
    __x = item->valuedouble;
    if (((2.220446049250313e-16 < ABS((double)item->valueint - __x)) || (2147483647.0 < __x)) ||
       (__x < -2147483648.0)) {
      pcVar2 = (char *)(*cJSON_malloc)(0x40);
      if (pcVar2 != (char *)0x0) {
        dVar16 = floor(__x);
        dVar17 = ABS(__x);
        if ((2.220446049250313e-16 < ABS(dVar16 - __x)) || (1e+60 <= dVar17)) {
          if ((dVar17 < 1e-06) || (1000000000.0 < dVar17)) {
            pcVar5 = "%e";
          }
          else {
            pcVar5 = "%f";
          }
        }
        else {
          pcVar5 = "%.0f";
        }
        sprintf(pcVar2,pcVar5,__x);
        return pcVar2;
      }
    }
    else {
      pcVar2 = (char *)(*cJSON_malloc)(0x15);
      if (pcVar2 != (char *)0x0) {
        sprintf(pcVar2,"%d",(ulong)(uint)item->valueint);
        return pcVar2;
      }
    }
    break;
  case 4:
  case 7:
    pcVar2 = print_string_ptr(item->valuestring,(uint)(item->type == 4));
    return pcVar2;
  case 5:
    pcVar11 = (cJSON *)&item->child;
    sVar10 = 0xfffffffffffffff8;
    uVar9 = 0;
    pcVar8 = pcVar11;
    do {
      pcVar8 = pcVar8->next;
      uVar9 = uVar9 - 1;
      sVar10 = sVar10 + 8;
    } while (pcVar8 != (cJSON *)0x0);
    if ((int)uVar9 == -1) {
      pcVar2 = (char *)(*cJSON_malloc)(3);
      if (pcVar2 != (char *)0x0) {
        pcVar2[2] = '\0';
        pcVar2[0] = '[';
        pcVar2[1] = ']';
        return pcVar2;
      }
    }
    else {
      __s = (*cJSON_malloc)(sVar10);
      if (__s != (void *)0x0) {
        uVar4 = ~uVar9;
        lVar12 = 0;
        memset(__s,0,sVar10);
        local_80 = 3 - (uint)(fmt == 0);
        iVar13 = 5;
LAB_0018bae8:
        bVar15 = true;
LAB_0018baeb:
        if ((bVar15) && (pcVar11 = pcVar11->next, pcVar11 != (cJSON *)0x0)) goto code_r0x0018bb02;
        if ((bVar15) &&
           (pcVar2 = (char *)(*cJSON_malloc)((long)iVar13), (bool)(bVar15 & pcVar2 != (char *)0x0)))
        {
          pcVar2[0] = '[';
          pcVar2[1] = '\0';
          pcVar5 = pcVar2 + 1;
          uVar14 = 0;
          while (bVar15 = uVar4 != 0, uVar4 = uVar4 - 1, bVar15) {
            strcpy(pcVar5,*(char **)((long)__s + uVar14 * 8));
            __s_00 = *(char **)((long)__s + uVar14 * 8);
            sVar6 = strlen(__s_00);
            pcVar5 = pcVar5 + sVar6;
            if ((-uVar9 - 2 & 0xffffffff) != uVar14) {
              *pcVar5 = ',';
              if (fmt == 0) {
                pcVar5 = pcVar5 + 1;
              }
              else {
                pcVar5[1] = ' ';
                pcVar5 = pcVar5 + 2;
              }
              *pcVar5 = '\0';
              __s_00 = *(char **)((long)__s + uVar14 * 8);
            }
            (*cJSON_free)(__s_00);
            uVar14 = uVar14 + 1;
          }
          (*cJSON_free)(__s);
          pcVar5[0] = ']';
          pcVar5[1] = '\0';
          return pcVar2;
        }
        for (uVar9 = 0; uVar4 != uVar9; uVar9 = uVar9 + 1) {
          pvVar3 = *(void **)((long)__s + uVar9 * 8);
          if (pvVar3 != (void *)0x0) {
            (*cJSON_free)(pvVar3);
          }
        }
        goto LAB_0018bd65;
      }
    }
    break;
  case 6:
    sVar10 = 0xfffffffffffffff8;
    pcVar11 = (cJSON *)&item->child;
    uVar9 = 0;
    pcVar8 = pcVar11;
    do {
      pcVar8 = pcVar8->next;
      uVar9 = uVar9 - 1;
      sVar10 = sVar10 + 8;
    } while (pcVar8 != (cJSON *)0x0);
    if ((int)uVar9 == -1) {
      iVar13 = 3;
      if (fmt != 0) {
        iVar13 = depth + 4;
      }
      pcVar2 = (char *)(*cJSON_malloc)((long)iVar13);
      if (pcVar2 != (char *)0x0) {
        *pcVar2 = '{';
        if (fmt == 0) {
          pcVar5 = pcVar2 + 1;
        }
        else {
          pcVar5 = pcVar2 + 2;
          pcVar2[1] = '\n';
          iVar13 = 1;
          if (1 < depth) {
            iVar13 = depth;
          }
          while (iVar13 + -1 != 0) {
            *pcVar5 = '\t';
            pcVar5 = pcVar5 + 1;
            iVar13 = iVar13 + -1;
          }
        }
        pcVar5[0] = '}';
        pcVar5[1] = '\0';
        return pcVar2;
      }
    }
    else {
      __s = (*cJSON_malloc)(sVar10);
      if (__s != (void *)0x0) {
        pvVar3 = (*cJSON_malloc)(sVar10);
        if (pvVar3 != (void *)0x0) {
          uVar4 = ~uVar9;
          lVar12 = 0;
          memset(__s,0,sVar10);
          memset(pvVar3,0,sVar10);
          local_64 = 7;
          if (fmt != 0) {
            local_64 = depth + 8;
          }
          iVar13 = 2;
          if (fmt != 0) {
            iVar13 = depth + 5;
          }
          bVar15 = false;
          while (bVar1 = bVar15, pcVar11 = pcVar11->next, pcVar11 != (cJSON *)0x0) {
            pcVar2 = print_string_ptr(pcVar11->string,1);
            *(char **)((long)pvVar3 + lVar12 * 8) = pcVar2;
            pcVar5 = print_value(pcVar11,depth + 1,fmt);
            *(char **)((long)__s + lVar12 * 8) = pcVar5;
            lVar12 = lVar12 + 1;
            bVar15 = true;
            if (pcVar5 != (char *)0x0 && pcVar2 != (char *)0x0) {
              sVar6 = strlen(pcVar5);
              sVar7 = strlen(pcVar2);
              local_64 = local_64 + iVar13 + (int)sVar7 + (int)sVar6;
              bVar15 = bVar1;
            }
          }
          if ((!bVar1) &&
             (pcVar2 = (char *)(*cJSON_malloc)((long)local_64), pcVar2 != (char *)0x0 && !bVar1)) {
            *pcVar2 = '{';
            if (fmt == 0) {
              pcVar5 = pcVar2 + 1;
            }
            else {
              pcVar5 = pcVar2 + 2;
              pcVar2[1] = '\n';
            }
            *pcVar5 = '\0';
            for (uVar4 = 0; ~uVar9 != uVar4; uVar4 = uVar4 + 1) {
              if (fmt != 0) {
                for (lVar12 = 0; (int)lVar12 <= depth; lVar12 = lVar12 + 1) {
                  pcVar5[lVar12] = '\t';
                }
                pcVar5 = pcVar5 + lVar12;
              }
              strcpy(pcVar5,*(char **)((long)pvVar3 + uVar4 * 8));
              sVar6 = strlen(*(char **)((long)pvVar3 + uVar4 * 8));
              pcVar5[sVar6] = ':';
              if (fmt == 0) {
                lVar12 = sVar6 + 1;
              }
              else {
                pcVar5[sVar6 + 1] = '\t';
                lVar12 = sVar6 + 2;
              }
              strcpy(pcVar5 + lVar12,*(char **)((long)__s + uVar4 * 8));
              sVar6 = strlen(*(char **)((long)__s + uVar4 * 8));
              pcVar5 = pcVar5 + lVar12 + sVar6;
              if (uVar4 != -(int)uVar9 - 2) {
                *pcVar5 = ',';
                pcVar5 = pcVar5 + 1;
              }
              if (fmt != 0) {
                *pcVar5 = '\n';
                pcVar5 = pcVar5 + 1;
              }
              *pcVar5 = '\0';
              (*cJSON_free)(*(void **)((long)pvVar3 + uVar4 * 8));
              (*cJSON_free)(*(void **)((long)__s + uVar4 * 8));
            }
            (*cJSON_free)(pvVar3);
            (*cJSON_free)(__s);
            if (fmt != 0) {
              iVar13 = 0;
              if (0 < depth) {
                iVar13 = depth;
              }
              while (iVar13 != 0) {
                *pcVar5 = '\t';
                pcVar5 = pcVar5 + 1;
                iVar13 = iVar13 + -1;
              }
            }
            pcVar5[0] = '}';
            pcVar5[1] = '\0';
            return pcVar2;
          }
          lVar12 = 0;
          while (bVar15 = uVar4 != 0, uVar4 = uVar4 - 1, bVar15) {
            if (*(void **)((long)pvVar3 + lVar12) != (void *)0x0) {
              (*cJSON_free)(*(void **)((long)pvVar3 + lVar12));
            }
            if (*(void **)((long)__s + lVar12) != (void *)0x0) {
              (*cJSON_free)(*(void **)((long)__s + lVar12));
            }
            lVar12 = lVar12 + 8;
          }
          (*cJSON_free)(pvVar3);
        }
LAB_0018bd65:
        (*cJSON_free)(__s);
      }
    }
  }
  return (char *)0x0;
code_r0x0018bb02:
  pcVar2 = print_value(pcVar11,depth + 1,fmt);
  *(char **)((long)__s + lVar12 * 8) = pcVar2;
  lVar12 = lVar12 + 1;
  bVar15 = false;
  if (pcVar2 != (char *)0x0) goto code_r0x0018bb22;
  goto LAB_0018baeb;
code_r0x0018bb22:
  sVar6 = strlen(pcVar2);
  iVar13 = iVar13 + local_80 + (int)sVar6;
  goto LAB_0018bae8;
}

Assistant:

static char *
print_value(cJSON *item, int depth, int fmt)
{
    char *out = 0;
    if (!item)
        return 0;
    switch ((item->type) & 255) {
        case cJSON_NULL:
            out = cJSON_strdup("null");
            break;
        case cJSON_False:
            out = cJSON_strdup("false");
            break;
        case cJSON_True:
            out = cJSON_strdup("true");
            break;
        case cJSON_Number:
            out = print_number(item);
            break;
        case cJSON_Array:
            out = print_array(item, depth, fmt);
            break;
        case cJSON_Object:
            out = print_object(item, depth, fmt);
            break;
        case cJSON_RawString:
        case cJSON_String:
            out = print_string(item);
            break;
    }
    return out;
}